

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.hpp
# Opt level: O2

void limonp::Split(string *src,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *res,string *pattern,size_t maxsplit)

{
  long lVar1;
  ulong uVar2;
  string sub;
  string local_50 [32];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(res);
  sub._M_dataplus._M_p = (pointer)&sub.field_2;
  sub._M_string_length = 0;
  sub.field_2._M_local_buf[0] = '\0';
  uVar2 = 0;
  do {
    if (src->_M_string_length <= uVar2) {
LAB_00147aae:
      std::__cxx11::string::~string((string *)&sub);
      return;
    }
    lVar1 = std::__cxx11::string::find_first_of((string *)src,(ulong)pattern);
    if ((lVar1 == -1) ||
       (maxsplit <=
        (ulong)((long)(res->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(res->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5))) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)src);
      std::__cxx11::string::operator=((string *)&sub,local_50);
      std::__cxx11::string::~string(local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(res,&sub);
      goto LAB_00147aae;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)src);
    std::__cxx11::string::operator=((string *)&sub,local_50);
    std::__cxx11::string::~string(local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(res,&sub);
    uVar2 = lVar1 + 1;
  } while( true );
}

Assistant:

inline void Split(const string& src, vector<string>& res, const string& pattern, size_t maxsplit = string::npos) {
  res.clear();
  size_t Start = 0;
  size_t end = 0;
  string sub;
  while(Start < src.size()) {
    end = src.find_first_of(pattern, Start);
    if(string::npos == end || res.size() >= maxsplit) {
      sub = src.substr(Start);
      res.push_back(sub);
      return;
    }
    sub = src.substr(Start, end - Start);
    res.push_back(sub);
    Start = end + 1;
  }
  return;
}